

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.cpp
# Opt level: O1

ParseTokenKind __thiscall TTD::TextFormatReader::ScanSpecialNumber(TextFormatReader *this)

{
  char16 cVar1;
  bool bVar2;
  ParseTokenKind PVar3;
  bool bVar4;
  char16 local_2a [4];
  char16 c;
  
  local_2a[0] = L'\0';
  bVar2 = FileReader::ReadRawChar(&this->super_FileReader,local_2a);
  cVar1 = local_2a[0];
  if (local_2a[0] == L'n' && bVar2) {
    bVar2 = FileReader::ReadRawChar(&this->super_FileReader,local_2a);
    if (!bVar2) {
      return Error;
    }
    if (local_2a[0] != L'a') {
      return Error;
    }
    bVar2 = FileReader::ReadRawChar(&this->super_FileReader,local_2a);
    bVar4 = local_2a[0] == L'n';
    PVar3 = NaN;
    goto LAB_00917b51;
  }
  if (bVar2) {
    if ((local_2a[0] == L'-') || (local_2a[0] == L'+')) {
      bVar2 = FileReader::ReadRawChar(&this->super_FileReader,local_2a);
      if (!bVar2) {
        return Error;
      }
      if (local_2a[0] != L'i') {
        return Error;
      }
      bVar2 = FileReader::ReadRawChar(&this->super_FileReader,local_2a);
      if (!bVar2) {
        return Error;
      }
      if (local_2a[0] != L'n') {
        return Error;
      }
      bVar2 = FileReader::ReadRawChar(&this->super_FileReader,local_2a);
      PVar3 = (cVar1 != L'+') + PosInfty;
      bVar4 = local_2a[0] == L'f';
      goto LAB_00917b51;
    }
    if ((bVar2) && ((local_2a[0] == L'u' || (local_2a[0] == L'l')))) {
      bVar2 = FileReader::ReadRawChar(&this->super_FileReader,local_2a);
      PVar3 = (cVar1 != L'u') + UpperBound;
      bVar4 = local_2a[0] == L'b';
      goto LAB_00917b51;
    }
  }
  if (!bVar2 || local_2a[0] != L'e') {
    return Error;
  }
  bVar2 = FileReader::ReadRawChar(&this->super_FileReader,local_2a);
  bVar4 = local_2a[0] == L'p';
  PVar3 = Epsilon;
LAB_00917b51:
  if (!bVar4) {
    PVar3 = Error;
  }
  if (bVar2 == false) {
    PVar3 = Error;
  }
  return PVar3;
}

Assistant:

NSTokens::ParseTokenKind TextFormatReader::ScanSpecialNumber()
    {
        char16 c = _u('\0');
        bool ok = this->ReadRawChar(&c);

        if(ok && c == _u('n'))
        {
            ok = this->ReadRawChar(&c);
            if(!ok || c != _u('a'))
            {
                return NSTokens::ParseTokenKind::Error;
            }

            ok = this->ReadRawChar(&c);
            if(!ok || c != _u('n'))
            {
                return NSTokens::ParseTokenKind::Error;
            }

            return NSTokens::ParseTokenKind::NaN;
        }
        else if(ok && (c == _u('+') || c == _u('-')))
        {
            char16 signc = c;

            ok = this->ReadRawChar(&c);
            if(!ok || c != _u('i'))
            {
                return NSTokens::ParseTokenKind::Error;
            }

            ok = this->ReadRawChar(&c);
            if(!ok || c != _u('n'))
            {
                return NSTokens::ParseTokenKind::Error;
            }

            ok = this->ReadRawChar(&c);
            if(!ok || c != _u('f'))
            {
                return NSTokens::ParseTokenKind::Error;
            }

            return (signc == _u('+')) ? NSTokens::ParseTokenKind::PosInfty : NSTokens::ParseTokenKind::NegInfty;
        }
        else if(ok && (c == _u('u') || c == _u('l')))
        {
            char16 limitc = c;

            ok = this->ReadRawChar(&c);
            if(!ok || c != _u('b'))
            {
                return NSTokens::ParseTokenKind::Error;
            }

            return (limitc == _u('u')) ? NSTokens::ParseTokenKind::UpperBound : NSTokens::ParseTokenKind::LowerBound;
        }
        else if(ok && c == _u('e'))
        {
            ok = this->ReadRawChar(&c);
            if(!ok || c != _u('p'))
            {
                return NSTokens::ParseTokenKind::Error;
            }

            return NSTokens::ParseTokenKind::Epsilon;
        }
        else
        {
            return NSTokens::ParseTokenKind::Error;
        }
    }